

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O2

int minimalFlip(word *pInOut,word *pMinimal,word *PDuplicat,int nVars,uint *p_uCanonPhase)

{
  int iVar1;
  int iVar2;
  size_t __n;
  undefined4 local_3c;
  
  local_3c = *p_uCanonPhase;
  iVar1 = Kit_TruthWordNum_64bit(nVars);
  __n = (size_t)(iVar1 << 3);
  memcpy(pMinimal,pInOut,__n);
  memcpy(PDuplicat,pInOut,__n);
  Kit_TruthChangePhase_64bit(pInOut,nVars,0);
  *(byte *)p_uCanonPhase = (byte)*p_uCanonPhase ^ 1;
  iVar1 = 1;
  while( true ) {
    iVar2 = memCompare(pMinimal,pInOut,nVars);
    if (nVars <= iVar1) break;
    if (iVar2 == 1) {
      memcpy(pMinimal,pInOut,__n);
      local_3c = *p_uCanonPhase;
    }
    else {
      memcpy(pInOut,pMinimal,__n);
      *p_uCanonPhase = local_3c;
    }
    Kit_TruthChangePhase_64bit(pInOut,nVars,iVar1);
    *p_uCanonPhase = *p_uCanonPhase ^ 1 << ((byte)iVar1 & 0x1f);
    iVar1 = iVar1 + 1;
  }
  if (iVar2 == -1) {
    memcpy(pInOut,pMinimal,__n);
    *p_uCanonPhase = local_3c;
  }
  iVar1 = bcmp(pInOut,PDuplicat,__n);
  return (int)(iVar1 != 0);
}

Assistant:

int minimalFlip(word* pInOut, word* pMinimal, word* PDuplicat, int  nVars, unsigned* p_uCanonPhase)
{
    int i;
    unsigned minTemp = *p_uCanonPhase;
    int blockSize = Kit_TruthWordNum_64bit( nVars )*sizeof(word);
    memcpy(pMinimal, pInOut, blockSize);
    memcpy(PDuplicat, pInOut, blockSize);       //////////////need one more unsigned!!!!!!!!!!!!!
    Kit_TruthChangePhase_64bit( pInOut, nVars, 0 );
    *p_uCanonPhase ^= (unsigned)1;
    for(i=1;i<nVars;i++)
    {
        if( memCompare(pMinimal,pInOut,nVars) == 1)
        {
            memcpy(pMinimal, pInOut, blockSize);
            minTemp = *p_uCanonPhase;
        }
        else
        {
            memcpy(pInOut, pMinimal, blockSize);
            *p_uCanonPhase = minTemp;
        }
        Kit_TruthChangePhase_64bit( pInOut, nVars, i );
        *p_uCanonPhase ^= (1 << i);
    }
    if( memCompare(pMinimal,pInOut,nVars) == -1)
    {
        memcpy(pInOut, pMinimal, blockSize);
        *p_uCanonPhase = minTemp;
    }
    if(memcmp(pInOut,PDuplicat,blockSize) == 0) 
        return 0;
    else
        return 1;
}